

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# language.c
# Opt level: O1

ctmbstr tidyErrorCodeAsString(uint code)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (code == 200) {
    return "CODES_TIDY_ERROR_FIRST";
  }
  uVar1 = 1;
  do {
    uVar2 = (ulong)uVar1;
    if (tidyErrorFilterKeysStruct[uVar2].key == (ctmbstr)0x0) {
      return "UNDEFINED";
    }
    uVar3 = (ulong)uVar1;
    uVar1 = uVar1 + 1;
  } while (tidyErrorFilterKeysStruct[uVar3].value != code);
  return tidyErrorFilterKeysStruct[uVar2].key;
}

Assistant:

ctmbstr tidyErrorCodeAsString(uint code)
{
    uint i = 0;
    while (tidyErrorFilterKeysStruct[i].key) {
        if ( tidyErrorFilterKeysStruct[i].value == code )
            return tidyErrorFilterKeysStruct[i].key;
        i++;
    }
    return "UNDEFINED";
}